

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

int lua_setmetatable(lua_State *L,int idx)

{
  int iVar1;
  TValue *pTVar2;
  lua_State *L_00;
  ulong uVar3;
  uint32_t uVar4;
  ulong uVar5;
  int in_ESI;
  lua_State *in_RDI;
  cTValue *o;
  GCtab *mt;
  global_State *g;
  GCobj *o_1;
  undefined4 in_stack_ffffffffffffffa8;
  ErrMsg in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  uint uVar6;
  undefined4 in_stack_ffffffffffffffb4;
  ulong local_38;
  
  pTVar2 = index2adr(in_RDI,in_ESI);
  if (*(int *)((long)in_RDI->top + -4) == -1) {
    local_38 = 0;
  }
  else {
    local_38 = (ulong)in_RDI->top[-1].u32.lo;
  }
  L_00 = (lua_State *)(ulong)(in_RDI->glref).ptr32;
  uVar4 = (uint32_t)local_38;
  if ((pTVar2->field_2).it == 0xfffffff4) {
    *(uint32_t *)((ulong)(pTVar2->u32).lo + 0x10) = uVar4;
    if (((local_38 != 0) && ((*(byte *)(local_38 + 4) & 3) != 0)) &&
       ((*(byte *)((ulong)(pTVar2->u32).lo + 4) & 4) != 0)) {
      uVar5 = (ulong)(in_RDI->glref).ptr32;
      uVar6 = (pTVar2->u32).lo;
      uVar3 = (ulong)uVar6;
      *(byte *)(uVar3 + 4) = *(byte *)(uVar3 + 4) & 0xfb;
      *(undefined4 *)(uVar3 + 0xc) = *(undefined4 *)(uVar5 + 0x3c);
      *(uint *)(uVar5 + 0x3c) = uVar6;
    }
  }
  else if ((pTVar2->field_2).it == 0xfffffff3) {
    *(uint32_t *)((ulong)(pTVar2->u32).lo + 0x10) = uVar4;
    if (((local_38 != 0) && ((*(byte *)(local_38 + 4) & 3) != 0)) &&
       ((*(byte *)((ulong)(pTVar2->u32).lo + 4) & 4) != 0)) {
      lj_gc_barrierf((global_State *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     (GCobj *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                     (GCobj *)0x116cb6);
    }
  }
  else {
    iVar1 = lj_trace_flushall(L_00);
    if (iVar1 != 0) {
      lj_err_caller((lua_State *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                    in_stack_ffffffffffffffac);
    }
    if (((pTVar2->field_2).it == 0xfffffffe) || ((pTVar2->field_2).it == 0xfffffffd)) {
      L_00[5].maxstack.ptr32 = uVar4;
      *(uint32_t *)((long)&L_00[5].top + 4) = uVar4;
    }
    else {
      if ((pTVar2->field_2).it < 0xffff0000) {
        uVar6 = 0xd;
      }
      else if ((int)(pTVar2->field_2).it >> 0xf == -2) {
        uVar6 = 3;
      }
      else {
        uVar6 = (pTVar2->field_2).it ^ 0xffffffff;
      }
      (&L_00[4].nextgc)[uVar6 + 0x16].gcptr32 = uVar4;
    }
  }
  in_RDI->top = in_RDI->top + -1;
  return 1;
}

Assistant:

LUA_API int lua_setmetatable(lua_State *L, int idx)
{
  global_State *g;
  GCtab *mt;
  cTValue *o = index2adr(L, idx);
  api_checknelems(L, 1);
  api_checkvalidindex(L, o);
  if (tvisnil(L->top-1)) {
    mt = NULL;
  } else {
    api_check(L, tvistab(L->top-1));
    mt = tabV(L->top-1);
  }
  g = G(L);
  if (tvistab(o)) {
    setgcref(tabV(o)->metatable, obj2gco(mt));
    if (mt)
      lj_gc_objbarriert(L, tabV(o), mt);
  } else if (tvisudata(o)) {
    setgcref(udataV(o)->metatable, obj2gco(mt));
    if (mt)
      lj_gc_objbarrier(L, udataV(o), mt);
  } else {
    /* Flush cache, since traces specialize to basemt. But not during __gc. */
    if (lj_trace_flushall(L))
      lj_err_caller(L, LJ_ERR_NOGCMM);
    if (tvisbool(o)) {
      /* NOBARRIER: basemt is a GC root. */
      setgcref(basemt_it(g, LJ_TTRUE), obj2gco(mt));
      setgcref(basemt_it(g, LJ_TFALSE), obj2gco(mt));
    } else {
      /* NOBARRIER: basemt is a GC root. */
      setgcref(basemt_obj(g, o), obj2gco(mt));
    }
  }
  L->top--;
  return 1;
}